

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_uint32 ma_pcm_rb_available_read(ma_pcm_rb *pRB)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (pRB != (ma_pcm_rb *)0x0) {
    uVar1 = (pRB->rb).encodedReadOffset;
    uVar2 = (pRB->rb).encodedWriteOffset;
    uVar3 = (uVar2 & 0x7fffffff) - (uVar1 & 0x7fffffff);
    if ((int)(uVar2 ^ uVar1) < 0) {
      uVar3 = uVar3 + (pRB->rb).subbufferSizeInBytes;
    }
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    return uVar3 / ((&DAT_001be730)[pRB->format] * pRB->channels);
  }
  return 0;
}

Assistant:

MA_API ma_uint32 ma_pcm_rb_available_read(ma_pcm_rb* pRB)
{
    if (pRB == NULL) {
        return 0;
    }

    return ma_rb_available_read(&pRB->rb) / ma_pcm_rb_get_bpf(pRB);
}